

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# walletdb.cpp
# Opt level: O0

bool __thiscall
wallet::WalletBatch::WriteMasterKey(WalletBatch *this,uint nID,CMasterKey *kMasterKey)

{
  byte bVar1;
  undefined8 in_RDI;
  undefined1 fOverwrite;
  long in_FS_OFFSET;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  *in_stack_ffffffffffffff88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff90;
  CMasterKey *value;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  WalletBatch *in_stack_ffffffffffffffb0;
  pointer local_8;
  
  fOverwrite = (undefined1)((ulong)in_RDI >> 0x38);
  local_8 = *(pointer *)(in_FS_OFFSET + 0x28);
  value = (CMasterKey *)&stack0xffffffffffffffd0;
  std::make_pair<std::__cxx11::string_const&,unsigned_int&>
            (in_stack_ffffffffffffff90,(uint *)in_stack_ffffffffffffff88);
  bVar1 = WriteIC<std::pair<std::__cxx11::string,unsigned_int>,wallet::CMasterKey>
                    (in_stack_ffffffffffffffb0,
                     (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
                      *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),value,
                     (bool)fOverwrite);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::~pair(in_stack_ffffffffffffff88);
  if (*(pointer *)(in_FS_OFFSET + 0x28) == local_8) {
    return (bool)(bVar1 & 1);
  }
  __stack_chk_fail();
}

Assistant:

bool WalletBatch::WriteMasterKey(unsigned int nID, const CMasterKey& kMasterKey)
{
    return WriteIC(std::make_pair(DBKeys::MASTER_KEY, nID), kMasterKey, true);
}